

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.h
# Opt level: O2

void __thiscall
aeron::archive::Configuration::Configuration(Configuration *this,Configuration *param_1)

{
  bool bVar1;
  undefined3 uVar2;
  int32_t iVar3;
  int32_t iVar4;
  
  this->messageTimeoutNs = param_1->messageTimeoutNs;
  std::__cxx11::string::string((string *)&this->controlChannel,(string *)&param_1->controlChannel);
  this->controlStreamId = param_1->controlStreamId;
  std::__cxx11::string::string
            ((string *)&this->localControlChannel,(string *)&param_1->localControlChannel);
  this->localControlStreamId = param_1->localControlStreamId;
  std::__cxx11::string::string
            ((string *)&this->controlResponseChannel,(string *)&param_1->controlResponseChannel);
  this->controlResponseStreamId = param_1->controlResponseStreamId;
  std::__cxx11::string::string
            ((string *)&this->recordingEventsChannel,(string *)&param_1->recordingEventsChannel);
  bVar1 = param_1->controlTermBufferSparse;
  uVar2 = *(undefined3 *)&param_1->field_0xa5;
  iVar3 = param_1->controlTermBufferLength;
  iVar4 = param_1->controlMtuLength;
  this->recordingEventsStreamId = param_1->recordingEventsStreamId;
  this->controlTermBufferSparse = bVar1;
  *(undefined3 *)&this->field_0xa5 = uVar2;
  this->controlTermBufferLength = iVar3;
  this->controlMtuLength = iVar4;
  return;
}

Assistant:

Configuration(const Configuration&) = default;